

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
calcu_in(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__return_storage_ptr__,int n,
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        *use,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *out,
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        *def)

{
  iterator iVar1;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> v1;
  int local_b4;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_b0;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_98;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_80;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_68;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_50;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_38;
  
  local_b4 = n;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::find(&out->_M_t,&local_b4);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b0,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             &iVar1._M_node[1]._M_parent);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::find(&def->_M_t,&local_b4);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_50,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b0);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_68,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             &iVar1._M_node[1]._M_parent);
  vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_38,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_50,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_68);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_M_move_assign
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b0,&local_38);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_38);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_68);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_50);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::find(&use->_M_t,&local_b4);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_80,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b0);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_98,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             &iVar1._M_node[1]._M_parent);
  vectors_set_union(__return_storage_ptr__,
                    (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_80,
                    (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_98);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_98);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_80);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

vector<mir::inst::VarId> calcu_in(int n, map<int, vector<mir::inst::VarId>> use,
                                  map<int, vector<mir::inst::VarId>> out,
                                  map<int, vector<mir::inst::VarId>> def) {
  // in[b] = use[b] U (out[b] - def[b])
  map<int, vector<mir::inst::VarId>>::iterator it;
  it = out.find(n);
  vector<mir::inst::VarId> v1 = it->second;
  it = def.find(n);
  v1 = vectors_difference(v1, it->second);
  it = use.find(n);
  return vectors_set_union(v1, it->second);
}